

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall
mp::NLFeeder_Easy::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter>
          (NLFeeder_Easy *this,ConBndWriter *cbw)

{
  long lVar1;
  
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons) {
    lVar1 = 0;
    do {
      NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteBndRangeOrCompl
                (cbw->nlw_,&cbw->nlw_->nm,(this->nlme_).row_lb_[lVar1],(this->nlme_).row_ub_[lVar1],
                 0,0);
      cbw->nWrt_ = cbw->nWrt_ + 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<header_.num_algebraic_cons; j++) {
      AlgConRange bnd;
      bnd.L = NLME().RowLowerBounds()[j];
      bnd.U = NLME().RowUpperBounds()[j];
      cbw.WriteAlgConRange(bnd);
    }
  }